

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int key_schedule_select_one(ptls_key_schedule_t *sched,ptls_cipher_suite_t *cs,int reset)

{
  anon_struct_16_2_62317c3f *paVar1;
  ptls_hash_context_t *ppVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ptls_hash_context_t **pppVar6;
  bool bVar7;
  
  if (sched->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x376,
                  "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)");
  }
  pppVar6 = &sched->hashes[0].ctx;
  sVar4 = 0xffffffffffffffff;
  for (sVar5 = 0; sVar5 != sched->num_hashes; sVar5 = sVar5 + 1) {
    if (((anon_struct_16_2_62317c3f *)(pppVar6 + -1))->algo == cs->hash) {
      bVar7 = sVar4 != 0xffffffffffffffff;
      sVar4 = sVar5;
      if (bVar7) {
        __assert_fail("found_slot == SIZE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0x37b,
                      "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)"
                     );
      }
    }
    else {
      (*(*pppVar6)->final)(*pppVar6,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    }
    pppVar6 = pppVar6 + 2;
  }
  if (sVar4 == 0) {
    sched->num_hashes = 1;
    if (reset == 0) {
      return 0;
    }
  }
  else {
    paVar1 = sched->hashes + sVar4;
    ppVar2 = paVar1->ctx;
    sched->hashes[0].algo = paVar1->algo;
    sched->hashes[0].ctx = ppVar2;
    sched->num_hashes = 1;
  }
  sched->generation = sched->generation - 1;
  sched->secret[0] = '\0';
  sched->secret[1] = '\0';
  sched->secret[2] = '\0';
  sched->secret[3] = '\0';
  sched->secret[4] = '\0';
  sched->secret[5] = '\0';
  sched->secret[6] = '\0';
  sched->secret[7] = '\0';
  sched->secret[8] = '\0';
  sched->secret[9] = '\0';
  sched->secret[10] = '\0';
  sched->secret[0xb] = '\0';
  sched->secret[0xc] = '\0';
  sched->secret[0xd] = '\0';
  sched->secret[0xe] = '\0';
  sched->secret[0xf] = '\0';
  sched->secret[0x10] = '\0';
  sched->secret[0x11] = '\0';
  sched->secret[0x12] = '\0';
  sched->secret[0x13] = '\0';
  sched->secret[0x14] = '\0';
  sched->secret[0x15] = '\0';
  sched->secret[0x16] = '\0';
  sched->secret[0x17] = '\0';
  sched->secret[0x18] = '\0';
  sched->secret[0x19] = '\0';
  sched->secret[0x1a] = '\0';
  sched->secret[0x1b] = '\0';
  sched->secret[0x1c] = '\0';
  sched->secret[0x1d] = '\0';
  sched->secret[0x1e] = '\0';
  sched->secret[0x1f] = '\0';
  sched->secret[0x20] = '\0';
  sched->secret[0x21] = '\0';
  sched->secret[0x22] = '\0';
  sched->secret[0x23] = '\0';
  sched->secret[0x24] = '\0';
  sched->secret[0x25] = '\0';
  sched->secret[0x26] = '\0';
  sched->secret[0x27] = '\0';
  sched->secret[0x28] = '\0';
  sched->secret[0x29] = '\0';
  sched->secret[0x2a] = '\0';
  sched->secret[0x2b] = '\0';
  sched->secret[0x2c] = '\0';
  sched->secret[0x2d] = '\0';
  sched->secret[0x2e] = '\0';
  sched->secret[0x2f] = '\0';
  sched->secret[0x30] = '\0';
  sched->secret[0x31] = '\0';
  sched->secret[0x32] = '\0';
  sched->secret[0x33] = '\0';
  sched->secret[0x34] = '\0';
  sched->secret[0x35] = '\0';
  sched->secret[0x36] = '\0';
  sched->secret[0x37] = '\0';
  sched->secret[0x38] = '\0';
  sched->secret[0x39] = '\0';
  sched->secret[0x3a] = '\0';
  sched->secret[0x3b] = '\0';
  sched->secret[0x3c] = '\0';
  sched->secret[0x3d] = '\0';
  sched->secret[0x3e] = '\0';
  sched->secret[0x3f] = '\0';
  iVar3 = key_schedule_extract(sched,(ptls_iovec_t)ZEXT816(0));
  if (iVar3 == 0) {
    return 0;
  }
  return iVar3;
}

Assistant:

static int key_schedule_select_one(ptls_key_schedule_t *sched, ptls_cipher_suite_t *cs, int reset)
{
    size_t found_slot = SIZE_MAX, i;
    int ret;

    assert(sched->generation == 1);

    /* find the one, while freeing others */
    for (i = 0; i != sched->num_hashes; ++i) {
        if (sched->hashes[i].algo == cs->hash) {
            assert(found_slot == SIZE_MAX);
            found_slot = i;
        } else {
            sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
        }
    }
    if (found_slot != 0) {
        sched->hashes[0] = sched->hashes[found_slot];
        reset = 1;
    }
    sched->num_hashes = 1;

    /* recalculate the hash if a different hash as been selected than the one we used for calculating the early secrets */
    if (reset) {
        --sched->generation;
        memset(sched->secret, 0, sizeof(sched->secret));
        if ((ret = key_schedule_extract(sched, ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}